

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall
QtPrivate::QCalendarDelegate::paintCell
          (QCalendarDelegate *this,QPainter *painter,QRect *rect,QDate date)

{
  QCalendarModel *pQVar1;
  Representation RVar2;
  Representation RVar3;
  Representation RVar4;
  long in_FS_OFFSET;
  int col;
  int row;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  RVar2.m_i = (rect->y1).m_i;
  RVar3.m_i = (rect->x2).m_i;
  RVar4.m_i = (rect->y2).m_i;
  (this->storedOption).super_QStyleOption.rect.x1 = (Representation)(rect->x1).m_i;
  (this->storedOption).super_QStyleOption.rect.y1 = (Representation)RVar2.m_i;
  (this->storedOption).super_QStyleOption.rect.x2 = (Representation)RVar3.m_i;
  (this->storedOption).super_QStyleOption.rect.y2 = (Representation)RVar4.m_i;
  local_3c = -1;
  local_40 = -1;
  QCalendarModel::cellForDate(this->calendarWidgetPrivate->m_model,date,&local_3c,&local_40);
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = this->calendarWidgetPrivate->m_model;
  (**(code **)(*(long *)pQVar1 + 0x60))((QModelIndex *)&local_58,pQVar1,local_3c,local_40);
  QStyledItemDelegate::paint
            ((QStyledItemDelegate *)this,painter,&this->storedOption,(QModelIndex *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarDelegate::paintCell(QPainter *painter, const QRect &rect, QDate date) const
{
    storedOption.rect = rect;
    int row = -1;
    int col = -1;
    calendarWidgetPrivate->m_model->cellForDate(date, &row, &col);
    QModelIndex idx = calendarWidgetPrivate->m_model->index(row, col);
    QStyledItemDelegate::paint(painter, storedOption, idx);
}